

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.hpp
# Opt level: O1

void __thiscall
asio::detail::
read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_asio::detail::transfer_exactly_t,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:1725:9)>
::operator()(read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_asio::detail::transfer_exactly_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1725:9)>
             *this,error_code *ec,size_t bytes_transferred,int start)

{
  state_type sVar1;
  socket_type sVar2;
  basic_streambuf<std::allocator<char>_> *pbVar3;
  basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_> *pbVar4;
  HTTPRequester *pHVar5;
  reactive_socket_recv_op<asio::mutable_buffers_1,_asio::detail::read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_asio::detail::transfer_exactly_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1725:9)>_>
  *op;
  error_category *peVar6;
  ErrorResult *pEVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  thread_info_base *this_thread;
  int iVar12;
  ulong uVar13;
  long in_FS_OFFSET;
  Result result;
  Result local_78;
  uint local_6c;
  ptr local_68;
  void *local_48;
  reactive_socket_service_base *local_40;
  base_implementation_type *local_38;
  
  this->start_ = start;
  uVar10 = this->total_transferred_;
  if (start == 1) {
    if ((ec->_M_value == 0) &&
       (uVar13 = (this->super_base_from_completion_cond<asio::detail::transfer_exactly_t>).
                 completion_condition_.size_, uVar8 = uVar13 - uVar10,
       uVar10 <= uVar13 && uVar8 != 0)) {
      uVar10 = 0x10000;
      if (uVar8 < 0x10000) {
        uVar10 = uVar8;
      }
    }
    else {
      uVar10 = 0;
    }
    pbVar3 = (this->buffers_).sb_;
    lVar11 = *(long *)&pbVar3->field_0x28 - *(long *)&pbVar3->field_0x10;
    uVar9 = (long)(pbVar3->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage -
            (long)((pbVar3->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar11);
    uVar8 = pbVar3->max_size_ - lVar11;
    if (uVar10 <= uVar8) {
      uVar8 = uVar10;
    }
    uVar13 = 0x200;
    if (0x200 < uVar9) {
      uVar13 = uVar9;
    }
    if (uVar8 < uVar13) {
      uVar13 = uVar8;
    }
  }
  else {
    uVar10 = uVar10 + bytes_transferred;
    this->total_transferred_ = uVar10;
    pbVar3 = (this->buffers_).sb_;
    lVar11 = *(long *)&pbVar3->field_0x28;
    iVar12 = (int)*(ulong *)&pbVar3->field_0x30 - (int)lVar11;
    if (lVar11 + bytes_transferred <= *(ulong *)&pbVar3->field_0x30) {
      iVar12 = (int)bytes_transferred;
    }
    lVar11 = iVar12 + lVar11;
    *(long *)&pbVar3->field_0x28 = lVar11;
    *(long *)&pbVar3->field_0x18 = lVar11;
    iVar12 = ec->_M_value;
    if ((iVar12 == 0) &&
       (uVar13 = (this->super_base_from_completion_cond<asio::detail::transfer_exactly_t>).
                 completion_condition_.size_, uVar8 = uVar13 - uVar10,
       uVar10 <= uVar13 && uVar8 != 0)) {
      uVar13 = 0x10000;
      if (uVar8 < 0x10000) {
        uVar13 = uVar8;
      }
    }
    else {
      uVar13 = 0;
    }
    lVar11 = lVar11 - *(long *)&pbVar3->field_0x10;
    uVar9 = (long)(pbVar3->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage -
            (long)((pbVar3->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar11);
    uVar8 = pbVar3->max_size_ - lVar11;
    if (uVar13 <= uVar8) {
      uVar8 = uVar13;
    }
    uVar13 = 0x200;
    if (0x200 < uVar9) {
      uVar13 = uVar9;
    }
    if (uVar8 < uVar13) {
      uVar13 = uVar8;
    }
    if ((bytes_transferred == 0 && iVar12 == 0) || (uVar8 == 0)) {
      pHVar5 = (this->handler_).this;
      pHVar5->AsyncRefs = pHVar5->AsyncRefs + -1;
      if (uVar10 == 0 || iVar12 != 0) {
        (**(code **)(*(long *)ec->_M_cat + 0x20))(&local_68,ec->_M_cat,iVar12);
        iVar12 = ec->_M_value;
        pEVar7 = (ErrorResult *)operator_new(0x38);
        pEVar7->Source = "Connection closed";
        (pEVar7->Description)._M_dataplus._M_p = (pointer)&(pEVar7->Description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&pEVar7->Description,local_68.h,
                   (undefined1 *)
                   ((long)&((local_68.h)->
                           super_base_from_completion_cond<asio::detail::transfer_exactly_t>).
                           completion_condition_.size_ +
                   (long)&((local_68.v)->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>
                          ).super_reactor_op.super_operation));
        pEVar7->Type = Asio;
        pEVar7->Code = (long)iVar12;
        local_78.Error = pEVar7;
        if (local_68.h !=
            (read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_asio::detail::transfer_exactly_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1725:9)>
             *)&local_68.p) {
          operator_delete(local_68.h);
        }
        tonk::gateway::HTTPRequester::OnDone(pHVar5,&local_78,0,(char *)0x0,0);
        tonk::Result::~Result(&local_78);
        return;
      }
      tonk::gateway::HTTPRequester::ContinueReadingBody(pHVar5);
      return;
    }
  }
  pbVar4 = this->stream_;
  pbVar3 = (this->buffers_).sb_;
  basic_streambuf<std::allocator<char>_>::reserve(pbVar3,uVar13);
  local_48 = *(void **)&pbVar3->field_0x28;
  local_38 = &(pbVar4->
              super_basic_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>).
              super_basic_io_object<asio::stream_socket_service<asio::ip::tcp>,_true>.
              implementation_.super_base_implementation_type;
  local_40 = &(((pbVar4->
                super_basic_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>).
                super_basic_io_object<asio::stream_socket_service<asio::ip::tcp>,_true>.service_)->
              service_impl_).super_reactive_socket_service_base;
  if (*(long *)(in_FS_OFFSET + -0x10) == 0) {
    this_thread = (thread_info_base *)0x0;
  }
  else {
    this_thread = *(thread_info_base **)(*(long *)(in_FS_OFFSET + -0x10) + 8);
  }
  local_6c = (uint)(this->start_ == 0);
  local_68.h = this;
  op = (reactive_socket_recv_op<asio::mutable_buffers_1,_asio::detail::read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_asio::detail::transfer_exactly_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1725:9)>_>
        *)thread_info_base::allocate(this_thread,0x88);
  local_68.p = (reactive_socket_recv_op<asio::mutable_buffers_1,_asio::detail::read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_asio::detail::transfer_exactly_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1725:9)>_>
                *)0x0;
  sVar2 = (pbVar4->super_basic_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>).
          super_basic_io_object<asio::stream_socket_service<asio::ip::tcp>,_true>.implementation_.
          super_base_implementation_type.socket_;
  sVar1 = (pbVar4->super_basic_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>).
          super_basic_io_object<asio::stream_socket_service<asio::ip::tcp>,_true>.implementation_.
          super_base_implementation_type.state_;
  (op->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.super_operation
  .next_ = (scheduler_operation *)0x0;
  (op->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.super_operation
  .func_ = reactive_socket_recv_op<asio::mutable_buffers_1,_asio::detail::read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_asio::detail::transfer_exactly_t,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:1725:9)>_>
           ::do_complete;
  (op->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.super_operation
  .task_result_ = 0;
  (op->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.ec_._M_value =
       0;
  local_68.v = op;
  peVar6 = (error_category *)std::_V2::system_category();
  (op->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.ec_._M_cat =
       peVar6;
  (op->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.
  bytes_transferred_ = 0;
  (op->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).super_reactor_op.perform_func_ =
       reactive_socket_recv_op_base<asio::mutable_buffers_1>::do_perform;
  (op->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).socket_ = sVar2;
  (op->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).state_ = sVar1;
  (op->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).buffers_.super_mutable_buffer.
  data_ = local_48;
  (op->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).buffers_.super_mutable_buffer.
  size_ = uVar13;
  (op->super_reactive_socket_recv_op_base<asio::mutable_buffers_1>).flags_ = 0;
  (op->handler_).super_base_from_completion_cond<asio::detail::transfer_exactly_t>.
  completion_condition_.size_ =
       (this->super_base_from_completion_cond<asio::detail::transfer_exactly_t>).
       completion_condition_.size_;
  (op->handler_).stream_ = this->stream_;
  (op->handler_).buffers_.sb_ = (this->buffers_).sb_;
  (op->handler_).start_ = this->start_;
  pHVar5 = (this->handler_).this;
  (op->handler_).total_transferred_ = this->total_transferred_;
  (op->handler_).handler_.this = pHVar5;
  local_68.p = op;
  reactive_socket_service_base::start_op
            (local_40,local_38,0,(reactor_op *)op,SUB41(local_6c,0),true,
             (bool)(uVar13 == 0 &
                   ((pbVar4->
                    super_basic_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>).
                    super_basic_io_object<asio::stream_socket_service<asio::ip::tcp>,_true>.
                    implementation_.super_base_implementation_type.state_ & 0x10) >> 4));
  local_68.v = (reactive_socket_recv_op<asio::mutable_buffers_1,_asio::detail::read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_asio::detail::transfer_exactly_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1725:9)>_>
                *)0x0;
  local_68.p = (reactive_socket_recv_op<asio::mutable_buffers_1,_asio::detail::read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_asio::detail::transfer_exactly_t,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_catid[P]tonk_TonkineseNAT_cpp:1725:9)>_>
                *)0x0;
  reactive_socket_recv_op<asio::mutable_buffers_1,_asio::detail::read_dynbuf_op<asio::basic_stream_socket<asio::ip::tcp,_asio::stream_socket_service<asio::ip::tcp>_>,_asio::basic_streambuf_ref<std::allocator<char>_>,_asio::detail::transfer_exactly_t,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/TonkineseNAT.cpp:1725:9)>_>
  ::ptr::reset(&local_68);
  return;
}

Assistant:

void operator()(const asio::error_code& ec,
        std::size_t bytes_transferred, int start = 0)
    {
      std::size_t max_size, bytes_available;
      switch (start_ = start)
      {
        case 1:
        max_size = this->check_for_completion(ec, total_transferred_);
        bytes_available = std::min<std::size_t>(
              std::max<std::size_t>(512,
                buffers_.capacity() - buffers_.size()),
              std::min<std::size_t>(max_size,
                buffers_.max_size() - buffers_.size()));
        for (;;)
        {
          stream_.async_read_some(buffers_.prepare(bytes_available),
              ASIO_MOVE_CAST(read_dynbuf_op)(*this));
          return; default:
          total_transferred_ += bytes_transferred;
          buffers_.commit(bytes_transferred);
          max_size = this->check_for_completion(ec, total_transferred_);
          bytes_available = std::min<std::size_t>(
                std::max<std::size_t>(512,
                  buffers_.capacity() - buffers_.size()),
                std::min<std::size_t>(max_size,
                  buffers_.max_size() - buffers_.size()));
          if ((!ec && bytes_transferred == 0) || bytes_available == 0)
            break;
        }

        handler_(ec, static_cast<const std::size_t&>(total_transferred_));
      }
    }